

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspm.cpp
# Opt level: O1

void __thiscall pg::MSPMSolver::coverlower(MSPMSolver *this,int node,int k)

{
  int *piVar1;
  ostream *poVar2;
  char cVar3;
  Game *pGVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  int *piVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  int *piVar12;
  int from;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int local_94;
  ulong local_90;
  _Deque_base<int,_std::allocator<int>_> local_88;
  
  lVar11 = (long)node;
  uVar10 = ((this->super_Solver).game)->_priority[lVar11];
  local_90 = CONCAT44(local_90._4_4_,uVar10);
  uVar10 = ~uVar10 & 1;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  uVar6 = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_88,0);
  pGVar4 = (this->super_Solver).game;
  if (lVar11 < pGVar4->n_vertices) {
    uVar6 = 0;
    do {
      if ((this->cover[lVar11] == 0) && ((int)local_90 < pGVar4->_priority[lVar11])) {
        this->cover[lVar11] = k;
        if (pGVar4->_inedges[pGVar4->_firstins[lVar11]] != -1) {
          piVar12 = pGVar4->_inedges + pGVar4->_firstins[lVar11];
          do {
            local_94 = *piVar12;
            uVar5 = (ulong)local_94;
            piVar1 = this->cover;
            if (piVar1[uVar5] == 0) {
              pGVar4 = (this->super_Solver).game;
              if (uVar10 != (((pGVar4->_owner)._bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0)) {
                iVar9 = pGVar4->_outedges[pGVar4->_firstouts[uVar5]];
                if (iVar9 != -1) {
                  piVar8 = pGVar4->_outedges + (long)pGVar4->_firstouts[uVar5] + 1;
                  bVar7 = false;
                  do {
                    if (piVar1[iVar9] == 0) {
                      bVar7 = true;
                      break;
                    }
                    iVar9 = *piVar8;
                    piVar8 = piVar8 + 1;
                  } while (iVar9 != -1);
                  if (bVar7) goto LAB_00164186;
                }
              }
              piVar1[uVar5] = k;
              if (1 < (this->super_Solver).trace) {
                if ((uVar6 & 1) == 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((this->super_Solver).logger,"\x1b[7;31;1mcovering\x1b[m ",0x15);
                }
                poVar2 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
                uVar6 = CONCAT71((int7)((ulong)poVar2 >> 8),1);
                std::ostream::operator<<(poVar2,local_94);
              }
              if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                          ((deque<int,std::allocator<int>> *)&local_88,&local_94);
              }
              else {
                *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_94;
                local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
            }
LAB_00164186:
            piVar1 = piVar12 + 1;
            piVar12 = piVar12 + 1;
          } while (*piVar1 != -1);
        }
      }
      lVar11 = lVar11 + 1;
      pGVar4 = (this->super_Solver).game;
    } while (lVar11 < pGVar4->n_vertices);
  }
  local_90 = uVar6;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      iVar9 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      pGVar4 = (this->super_Solver).game;
      piVar12 = pGVar4->_inedges;
      iVar9 = pGVar4->_firstins[iVar9];
      if (piVar12[iVar9] != -1) {
        piVar12 = piVar12 + iVar9;
        do {
          local_94 = *piVar12;
          uVar6 = (ulong)local_94;
          piVar1 = this->cover;
          if (piVar1[uVar6] == 0) {
            pGVar4 = (this->super_Solver).game;
            if (uVar10 != (((pGVar4->_owner)._bits[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0)) {
              iVar9 = pGVar4->_outedges[pGVar4->_firstouts[uVar6]];
              if (iVar9 != -1) {
                piVar8 = pGVar4->_outedges + (long)pGVar4->_firstouts[uVar6] + 1;
                bVar7 = false;
                do {
                  if (piVar1[iVar9] == 0) {
                    bVar7 = true;
                    break;
                  }
                  iVar9 = *piVar8;
                  piVar8 = piVar8 + 1;
                } while (iVar9 != -1);
                if (bVar7) goto LAB_001642fb;
              }
            }
            piVar1[uVar6] = k;
            if (1 < (this->super_Solver).trace) {
              poVar2 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
              std::ostream::operator<<(poVar2,local_94);
            }
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                        ((deque<int,std::allocator<int>> *)&local_88,&local_94);
            }
            else {
              *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_94;
              local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
          }
LAB_001642fb:
          piVar1 = piVar12 + 1;
          piVar12 = piVar12 + 1;
        } while (*piVar1 != -1);
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  if ((local_90 & 1) != 0) {
    poVar2 = (this->super_Solver).logger;
    cVar3 = (char)poVar2;
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_88);
  return;
}

Assistant:

void
MSPMSolver::coverlower(int node, int k)
{
    // initialize
    const int pr = priority(node);
    const int pl = 1-(pr&1); // attract for other player

    bool banner = false;

    std::queue<int> q;

    for (int n=node; n<nodecount(); n++) {
        if (cover[n]) continue; // also for "disabled"
        if (priority(n) <= pr) continue; // skip nodes of same priority
        cover[n] = k;
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            if (cover[from]) continue;
            if (owner(from) != pl) {
                bool escapes = false;
                for (auto curedge = outs(from); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (cover[to]) continue;
                    escapes = true;
                    break;
                }
                if (escapes) continue;
            }
            cover[from] = k;
            if (trace >= 2) {
                if (!banner) logger << "\033[7;31;1mcovering\033[m ";
                banner = true;
                logger << " " << from;
            }
            q.push(from);
        }
    }

    while (!q.empty()) {
        int n = q.front();
        q.pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            if (cover[from]) continue;
            if (owner(from) != pl) {
                bool escapes = false;
                for (auto curedge = outs(from); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (cover[to]) continue;
                    escapes = true;
                    break;
                }
                if (escapes) continue;
            }
            cover[from] = k;
            if (trace >= 2) logger << " " << from;
            q.push(from);
        }
    }

    if (banner) logger << std::endl;
}